

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O1

void bloaty::wasm::ReadCodeSection
               (Section *section,IndexedNames *names,uint32_t num_imports,RangeSink *sink)

{
  __node_base_ptr p_Var1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char cVar5;
  char cVar6;
  uint64_t uVar7;
  ulong uVar8;
  __node_base_ptr p_Var9;
  _Hash_node_base *p_Var10;
  long *plVar11;
  uint uVar12;
  long *plVar13;
  size_type *psVar14;
  undefined4 in_register_00000014;
  ulong uVar15;
  int iVar16;
  __node_base_ptr p_Var17;
  uint __val;
  ulong filesize;
  string_view symbol;
  string_view name_00;
  string_view name_01;
  string name;
  string __str;
  string local_b8;
  string_view local_98;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  uint local_60;
  long local_58 [2];
  uint64_t local_48;
  IndexedNames *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,num_imports);
  local_98._M_len = (section->contents)._M_len;
  local_98._M_str = (section->contents)._M_str;
  __val = 0;
  local_40 = names;
  local_48 = ReadLEB128Internal(false,0x20,&local_98);
  if ((int)local_48 != 0) {
    do {
      pcVar4 = local_98._M_str;
      sVar3 = local_98._M_len;
      uVar7 = ReadLEB128Internal(false,0x20,&local_98);
      filesize = (ulong)(uint)((int)local_98._M_str + ((int)uVar7 - (int)pcVar4));
      if (sVar3 < filesize) {
        Throw("region out-of-bounds",0x5d);
      }
      uVar8 = uVar7 & 0xffffffff;
      if (local_98._M_len < uVar8) {
        Throw("region out-of-bounds",100);
      }
      local_98._M_str = local_98._M_str + uVar8;
      iVar16 = __val + (int)local_38;
      uVar15 = (local_40->_M_h)._M_bucket_count;
      p_Var1 = (local_40->_M_h)._M_buckets[(ulong)(long)iVar16 % uVar15];
      p_Var9 = (__node_base_ptr)0x0;
      if ((p_Var1 != (__node_base_ptr)0x0) &&
         (p_Var9 = p_Var1, p_Var17 = p_Var1->_M_nxt, iVar16 != *(int *)&p_Var1->_M_nxt[1]._M_nxt)) {
        while (p_Var10 = p_Var17->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
          p_Var9 = (__node_base_ptr)0x0;
          if (((ulong)(long)*(int *)&p_Var10[1]._M_nxt % uVar15 != (ulong)(long)iVar16 % uVar15) ||
             (p_Var9 = p_Var17, p_Var17 = p_Var10, iVar16 == *(int *)&p_Var10[1]._M_nxt))
          goto LAB_0019d732;
        }
        p_Var9 = (__node_base_ptr)0x0;
      }
LAB_0019d732:
      if (p_Var9 == (__node_base_ptr)0x0) {
        p_Var10 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var10 = p_Var9->_M_nxt;
      }
      if (p_Var10 == (_Hash_node_base *)0x0) {
        cVar6 = '\x01';
        if (9 < __val) {
          uVar15 = (ulong)__val;
          cVar5 = '\x04';
          do {
            cVar6 = cVar5;
            uVar12 = (uint)uVar15;
            if (uVar12 < 100) {
              cVar6 = cVar6 + -2;
              goto LAB_0019d7ef;
            }
            if (uVar12 < 1000) {
              cVar6 = cVar6 + -1;
              goto LAB_0019d7ef;
            }
            if (uVar12 < 10000) goto LAB_0019d7ef;
            uVar15 = uVar15 / 10000;
            cVar5 = cVar6 + '\x04';
          } while (99999 < uVar12);
          cVar6 = cVar6 + '\x01';
        }
LAB_0019d7ef:
        local_68 = local_58;
        local_98._M_len = local_98._M_len - uVar8;
        std::__cxx11::string::_M_construct((ulong)&local_68,cVar6);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_68,local_60,__val);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x345e34);
        local_88 = &local_78;
        plVar13 = plVar11 + 2;
        if ((long *)*plVar11 == plVar13) {
          local_78 = *plVar13;
          lStack_70 = plVar11[3];
        }
        else {
          local_78 = *plVar13;
          local_88 = (long *)*plVar11;
        }
        local_80 = plVar11[1];
        *plVar11 = (long)plVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_88);
        psVar14 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_b8.field_2._M_allocated_capacity = *psVar14;
          local_b8.field_2._8_8_ = plVar11[3];
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar14;
          local_b8._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_b8._M_string_length = plVar11[1];
        *plVar11 = (long)psVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if (local_68 != local_58) {
          operator_delete(local_68,local_58[0] + 1);
        }
        pcVar2 = (sink->file_->data_)._M_str;
        if ((pcVar2 <= pcVar4) && (pcVar4 < pcVar2 + (sink->file_->data_)._M_len)) {
          name_01._M_str = local_b8._M_dataplus._M_p;
          name_01._M_len = local_b8._M_string_length;
          RangeSink::AddFileRange(sink,"wasm_function",name_01,(long)pcVar4 - (long)pcVar2,filesize)
          ;
        }
      }
      else {
        symbol._M_str._0_4_ = sink->data_source_;
        symbol._M_len = (size_t)p_Var10[2]._M_nxt;
        symbol._M_str._4_4_ = 0;
        local_98._M_len = local_98._M_len - uVar8;
        ItaniumDemangle_abi_cxx11_(&local_b8,(bloaty *)p_Var10[3]._M_nxt,symbol,(DataSource)uVar15);
        pcVar2 = (sink->file_->data_)._M_str;
        if ((pcVar2 <= pcVar4) && (pcVar4 < pcVar2 + (sink->file_->data_)._M_len)) {
          name_00._M_str = local_b8._M_dataplus._M_p;
          name_00._M_len = local_b8._M_string_length;
          RangeSink::AddFileRange(sink,"wasm_function",name_00,(long)pcVar4 - (long)pcVar2,filesize)
          ;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      __val = __val + 1;
    } while (__val != (uint)local_48);
  }
  return;
}

Assistant:

void ReadCodeSection(const Section& section, const IndexedNames& names,
                     uint32_t num_imports, RangeSink* sink) {
  string_view data = section.contents;

  uint32_t count = ReadVarUInt32(&data);

  for (uint32_t i = 0; i < count; i++) {
    string_view func = data;
    uint32_t size = ReadVarUInt32(&data);
    uint32_t total_size = size + (data.data() - func.data());

    func = StrictSubstr(func, 0, total_size);
    data = StrictSubstr(data, size);

    auto iter = names.find(num_imports + i);

    if (iter == names.end()) {
      std::string name = "func[" + std::to_string(i) + "]";
      sink->AddFileRange("wasm_function", name, func);
    } else {
      sink->AddFileRange("wasm_function", ItaniumDemangle(iter->second, sink->data_source()), func);
    }
  }
}